

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm.cpp
# Opt level: O3

void EBPLM::PredictVelOnXFace
               (Box *xebox,Array4<double> *Imx,Array4<double> *Ipx,Array4<const_double> *q,
               Array4<const_double> *ccvel,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  BCRec *bcrec;
  long lVar33;
  double *pdVar34;
  double *pdVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  double *pdVar39;
  long lVar40;
  long lVar41;
  double *pdVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  double *pdVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  EBCellFlag *pEVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  double *pdVar55;
  long lVar56;
  long lVar57;
  double *pdVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  double *pdVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  double *pdVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  undefined1 auVar70 [16];
  undefined8 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  int iVar84;
  pair<bool,_bool> pVar85;
  pair<bool,_bool> pVar86;
  pair<bool,_bool> pVar87;
  int jj;
  int iVar88;
  int iVar89;
  uint uVar90;
  long lVar91;
  ulong uVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  ulong uVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  double *pdVar114;
  long lVar115;
  Long *pLVar116;
  long lVar117;
  byte bVar118;
  int iVar119;
  int iVar120;
  uint uVar121;
  int iVar122;
  ulong uVar123;
  long lVar124;
  long lVar125;
  long lVar126;
  long lVar127;
  long lVar128;
  long lVar129;
  long lVar130;
  long lVar131;
  long lVar132;
  long lVar133;
  long lVar134;
  long lVar135;
  long lVar136;
  long lVar137;
  long lVar138;
  long lVar139;
  long lVar140;
  long lVar141;
  byte bVar142;
  int dir;
  int dir_00;
  int iVar143;
  int iVar144;
  double *pdVar145;
  int iVar146;
  long lVar147;
  long lVar148;
  long lVar149;
  bool bVar150;
  long lVar151;
  double *pdVar152;
  double *pdVar153;
  char cVar154;
  uint uVar155;
  long lVar156;
  long lVar157;
  long lVar158;
  double *pdVar159;
  double *pdVar160;
  int iVar161;
  char cVar162;
  int iVar163;
  double **ppdVar164;
  long lVar165;
  int iVar166;
  int iVar167;
  int iVar168;
  long lVar169;
  long lVar170;
  long lVar171;
  byte bVar172;
  int iVar173;
  double *pdVar174;
  double *pdVar175;
  int iVar176;
  int iVar177;
  int iVar178;
  long lVar179;
  long lVar180;
  bool bVar181;
  ulong uVar182;
  double dVar183;
  double dVar184;
  double dVar186;
  double dVar187;
  undefined1 auVar185 [16];
  double dVar188;
  ulong uVar189;
  double dVar190;
  double dVar191;
  undefined1 auVar192 [16];
  double dVar193;
  double dVar194;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  undefined4 uVar201;
  undefined4 uVar202;
  undefined4 uVar203;
  undefined4 uVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  Real du [27];
  Real A [27] [3];
  long local_970;
  double *local_888;
  long local_7e0;
  double *local_758;
  double *local_698;
  double adStack_3b8 [28];
  anon_class_680_18_15492e0f local_2d8;
  
  dVar183 = dt / (geom->super_CoordSys).dx[0];
  iVar177 = (geom->domain).smallend.vect[0];
  iVar178 = (geom->domain).smallend.vect[1];
  bcrec = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  iVar168 = (geom->domain).bigend.vect[0];
  iVar4 = (geom->domain).bigend.vect[1];
  pVar85 = anon_unknown.dwarf_632572::has_extdir_or_ho(bcrec,0,(int)Ipx);
  pVar86 = anon_unknown.dwarf_632572::has_extdir_or_ho(bcrec,1,dir);
  iVar5 = (geom->domain).smallend.vect[2];
  iVar6 = (geom->domain).bigend.vect[2];
  pVar87 = anon_unknown.dwarf_632572::has_extdir_or_ho(bcrec,2,dir_00);
  if ((((ushort)pVar85 & 1) == 0) || (iVar177 < (xebox->smallend).vect[0] + -1)) {
    iVar7 = (xebox->bigend).vect[0];
    if ((((iVar7 < iVar168 || ((ushort)pVar85 >> 8 & 1) == 0) &&
         ((((ushort)pVar87 & 1) == 0 || (iVar5 < (xebox->smallend).vect[2] + -1)))) &&
        ((((ushort)pVar87 >> 8 & 1) == 0 || ((xebox->bigend).vect[2] < iVar6)))) &&
       (((((ushort)pVar86 & 1) == 0 || (iVar178 < (xebox->smallend).vect[1] + -1)) &&
        ((((ushort)pVar86 >> 8 & 1) == 0 || ((xebox->bigend).vect[1] < iVar4)))))) {
      lVar33 = ccc->nstride;
      iVar177 = (ccc->begin).x;
      lVar91 = (long)iVar177;
      pdVar34 = ccc->p;
      uVar8 = (q->begin).x;
      lVar147 = (long)(int)uVar8;
      iVar178 = (xebox->smallend).vect[0];
      lVar165 = (long)iVar178;
      pdVar35 = q->p;
      lVar36 = q->jstride;
      lVar37 = q->kstride;
      lVar38 = q->nstride;
      iVar168 = (q->begin).y;
      uVar123 = (ulong)iVar168;
      iVar4 = (q->begin).z;
      uVar92 = (ulong)iVar4;
      pdVar39 = ccvel->p;
      lVar40 = ccvel->jstride;
      lVar41 = ccvel->kstride;
      lVar149 = (long)(ccvel->begin).x;
      iVar5 = (ccvel->begin).y;
      iVar6 = (ccvel->begin).z;
      pdVar42 = Imx->p;
      lVar43 = Imx->jstride;
      lVar44 = Imx->kstride;
      lVar45 = Imx->nstride;
      iVar7 = (Imx->begin).x;
      iVar9 = (Imx->begin).y;
      iVar10 = (Imx->begin).z;
      pdVar46 = Ipx->p;
      lVar47 = Ipx->jstride;
      lVar48 = Ipx->kstride;
      lVar49 = Ipx->nstride;
      uVar11 = (Ipx->begin).x;
      iVar12 = (Ipx->begin).y;
      iVar13 = (Ipx->begin).z;
      pEVar50 = flag->p;
      lVar51 = flag->jstride;
      lVar52 = flag->kstride;
      lVar156 = (long)(flag->begin).x;
      iVar14 = (flag->begin).y;
      iVar146 = (flag->begin).z;
      lVar53 = ccc->jstride;
      lVar54 = ccc->kstride;
      iVar15 = (ccc->begin).y;
      iVar16 = (ccc->begin).z;
      pdVar55 = vfrac->p;
      lVar56 = vfrac->jstride;
      lVar57 = vfrac->kstride;
      iVar17 = (vfrac->begin).x;
      lVar179 = (long)iVar17;
      uVar18 = (vfrac->begin).y;
      lVar93 = (long)(int)uVar18;
      uVar19 = (vfrac->begin).z;
      lVar124 = (long)(int)uVar19;
      pdVar58 = fcx->p;
      lVar59 = fcx->jstride;
      lVar60 = fcx->kstride;
      lVar61 = fcx->nstride;
      iVar20 = (fcx->begin).x;
      lVar169 = (long)iVar20;
      iVar21 = (fcx->begin).y;
      iVar22 = (fcx->begin).z;
      pdVar62 = fcy->p;
      lVar63 = fcy->jstride;
      lVar64 = fcy->kstride;
      lVar65 = fcy->nstride;
      lVar170 = (long)(fcy->begin).x;
      iVar23 = (fcy->begin).y;
      iVar24 = (fcy->begin).z;
      pdVar66 = fcz->p;
      lVar67 = fcz->jstride;
      lVar68 = fcz->kstride;
      lVar69 = fcz->nstride;
      lVar171 = (long)(fcz->begin).x;
      iVar25 = (fcz->begin).y;
      iVar26 = (fcz->begin).z;
      iVar27 = (xebox->smallend).vect[1];
      iVar28 = (xebox->smallend).vect[2];
      iVar29 = (xebox->bigend).vect[0];
      iVar30 = (xebox->bigend).vect[1];
      iVar31 = (xebox->bigend).vect[2];
      local_758 = pdVar35 + ((lVar165 + -2) - lVar147);
      local_7e0 = 0;
      do {
        if (iVar28 <= iVar31) {
          lVar125 = local_7e0 * lVar38;
          lVar117 = (long)iVar28;
          do {
            if (iVar27 <= iVar30) {
              lVar94 = (lVar117 - iVar146) * lVar52;
              lVar141 = lVar117 + 1;
              lVar126 = (lVar117 - lVar124) * lVar57;
              lVar95 = (lVar117 - uVar92) * lVar37;
              lVar180 = (lVar117 - iVar6) * lVar41;
              lVar127 = (lVar117 - iVar22) * lVar60;
              lVar128 = (lVar117 - iVar16) * lVar54;
              iVar173 = (int)lVar117;
              iVar119 = iVar173 - iVar4;
              lVar129 = iVar119 * lVar37;
              lVar130 = ((lVar117 + -1) - lVar124) * lVar57;
              lVar131 = (lVar141 - lVar124) * lVar57;
              lVar151 = ((lVar117 + -1) - uVar92) * lVar37;
              lVar132 = (lVar141 - uVar92) * lVar37;
              lVar133 = (lVar117 - iVar24) * lVar64;
              lVar157 = ((int)lVar141 - iVar26) * lVar68;
              lVar158 = (lVar117 - iVar26) * lVar68;
              lVar134 = (int)(~uVar19 + iVar173) * lVar57;
              lVar135 = (int)((int)lVar141 - uVar19) * lVar57;
              lVar96 = (~(long)iVar16 + lVar117) * lVar54;
              lVar141 = (long)iVar27;
              do {
                if (iVar29 < iVar178) {
                  uVar97 = lVar141 + 1U & 0xffffffff;
                }
                else {
                  lVar98 = (lVar141 - iVar14) * lVar51;
                  lVar99 = (lVar141 - lVar93) * lVar56;
                  lVar100 = (lVar141 - uVar123) * lVar36;
                  lVar101 = (lVar141 - iVar5) * lVar40;
                  lVar102 = (lVar141 - iVar21) * lVar59;
                  lVar103 = (lVar141 - iVar15) * lVar53;
                  iVar176 = (int)lVar141;
                  iVar88 = iVar176 - iVar168;
                  lVar104 = iVar88 * lVar36;
                  lVar136 = ((lVar141 + -1) - lVar93) * lVar56;
                  uVar97 = lVar141 + 1;
                  lVar137 = (uVar97 - lVar93) * lVar56;
                  lVar105 = ((lVar141 + -1) - uVar123) * lVar36;
                  lVar106 = (uVar97 - uVar123) * lVar36;
                  lVar107 = ((int)uVar97 - iVar23) * lVar63;
                  lVar108 = (lVar141 - iVar23) * lVar63;
                  lVar109 = (lVar141 - iVar25) * lVar67;
                  lVar110 = (int)(~uVar18 + iVar176) * lVar56;
                  lVar111 = (int)((int)uVar97 - uVar18) * lVar56;
                  lVar112 = (~(long)iVar15 + lVar141) * lVar53;
                  lVar138 = lVar165 + lVar96 + lVar112;
                  pdVar145 = pdVar34 + ((lVar112 + lVar96 + lVar33 + lVar165 + -1) - lVar91);
                  pdVar159 = pdVar34 + ((lVar33 * 2 + lVar138 + -1) - lVar91);
                  local_698 = pdVar34 + ((lVar138 + -1) - lVar91);
                  lVar138 = (long)local_758 +
                            (lVar141 + ~uVar123) * lVar36 * 8 + (lVar117 + ~uVar92) * lVar37 * 8;
                  lVar112 = lVar165;
                  iVar3 = (iVar178 + -2) - uVar8;
                  iVar163 = ~uVar8 + iVar178;
                  iVar84 = (iVar178 + -2) - iVar177;
                  do {
                    uVar32 = pEVar50[lVar94 + lVar98 + (lVar112 - lVar156)].flag;
                    dVar184 = 0.0;
                    dVar212 = 0.0;
                    iVar89 = (int)lVar112;
                    if ((uVar32 >> 0x11 & 1) != 0) {
                      lVar139 = lVar112 - lVar179;
                      dVar194 = pdVar55[lVar99 + lVar139 + lVar126];
                      lVar2 = lVar112 + -1;
                      if ((dVar194 != 1.0) || (NAN(dVar194))) {
LAB_00310b2f:
                        dVar212 = pdVar58[lVar127 + lVar102 + (lVar112 - lVar169)];
                        dVar197 = (pdVar58 + lVar127 + lVar102 + (lVar112 - lVar169))[lVar61];
                        lVar113 = lVar112 - lVar91;
                        dVar191 = pdVar34[lVar128 + lVar103 + lVar113];
                        dVar207 = pdVar34[lVar128 + lVar103 + lVar113 + lVar33];
                        dVar199 = pdVar34[lVar128 + lVar103 + lVar113 + lVar33 * 2];
                        lVar113 = (long)(int)(iVar89 - uVar8);
                        dVar193 = pdVar35[lVar104 + lVar113 + lVar129 + lVar125];
                        dVar209 = pdVar35[lVar104 + lVar129 + lVar125 + (lVar2 - lVar147)];
                        lVar140 = -1;
                        cVar154 = '\x05';
                        lVar148 = 0;
                        pdVar114 = local_698;
                        pdVar152 = pdVar159;
                        pdVar174 = pdVar145;
                        do {
                          lVar115 = -1;
                          pdVar153 = pdVar152;
                          pdVar160 = pdVar114;
                          pdVar175 = pdVar174;
                          cVar162 = cVar154;
                          do {
                            iVar144 = (int)lVar148;
                            ppdVar164 = &local_2d8.q.p + (long)iVar144 * 3;
                            lVar148 = 0;
                            do {
                              iVar120 = (int)lVar148 + -1;
                              if ((((int)lVar115 == 0 && (int)lVar140 == 0) && iVar120 == 0) ||
                                 ((1 << (cVar162 + (char)lVar148 & 0x1fU) & uVar32) == 0)) {
                                *ppdVar164 = (double *)0x0;
                                ppdVar164[1] = (double *)0x0;
                                ppdVar164[2] = (double *)0x0;
                              }
                              else {
                                dVar184 = pdVar175[lVar148];
                                *ppdVar164 = (double *)
                                             ((pdVar160[lVar148] + (double)iVar120) - dVar191);
                                ppdVar164[1] = (double *)
                                               ((dVar184 + (double)(int)lVar115) - dVar207);
                                ppdVar164[2] = (double *)
                                               ((pdVar153[lVar148] + (double)(int)lVar140) - dVar199
                                               );
                              }
                              lVar148 = lVar148 + 1;
                              ppdVar164 = ppdVar164 + 3;
                            } while (lVar148 != 3);
                            lVar115 = lVar115 + 1;
                            pdVar153 = pdVar153 + lVar53;
                            pdVar175 = pdVar175 + lVar53;
                            pdVar160 = pdVar160 + lVar53;
                            cVar162 = cVar162 + '\x03';
                            lVar148 = (long)iVar144 + 3;
                          } while (lVar115 != 2);
                          lVar140 = lVar140 + 1;
                          pdVar152 = pdVar152 + lVar54;
                          pdVar174 = pdVar174 + lVar54;
                          pdVar114 = pdVar114 + lVar54;
                          cVar154 = cVar154 + '\t';
                          lVar148 = (long)iVar144 + 3;
                        } while (lVar140 != 2);
                        lVar148 = -1;
                        cVar154 = '\x05';
                        lVar140 = 0;
                        do {
                          lVar115 = -1;
                          cVar162 = cVar154;
                          do {
                            iVar144 = (int)lVar140;
                            lVar140 = 0;
                            do {
                              dVar184 = 0.0;
                              if (((int)lVar140 != 1 || ((int)lVar115 != 0 || (int)lVar148 != 0)) &&
                                 ((1 << (cVar162 + (char)lVar140 & 0x1fU) & uVar32) != 0)) {
                                dVar184 = pdVar35[lVar125 + (iVar119 + (int)lVar148) * lVar37 +
                                                            (iVar88 + (int)lVar115) * lVar36 +
                                                            (long)(iVar163 + (int)lVar140)] -
                                          dVar193;
                              }
                              adStack_3b8[iVar144 + lVar140] = dVar184;
                              lVar140 = lVar140 + 1;
                            } while (lVar140 != 3);
                            lVar115 = lVar115 + 1;
                            cVar162 = cVar162 + '\x03';
                            lVar140 = (long)iVar144 + 3;
                          } while (lVar115 != 2);
                          lVar148 = lVar148 + 1;
                          cVar154 = cVar154 + '\t';
                          lVar140 = (long)iVar144 + 3;
                        } while (lVar148 != 2);
                        dVar197 = dVar197 - dVar199;
                        dVar184 = 0.0;
                        dVar186 = 0.0;
                        dVar205 = 0.0;
                        pLVar116 = &local_2d8.q.kstride;
                        lVar140 = 0;
                        dVar188 = 0.0;
                        dVar190 = 0.0;
                        dVar213 = 0.0;
                        dVar214 = 0.0;
                        dVar198 = 0.0;
                        dVar200 = 0.0;
                        do {
                          pdVar114 = ((Array4<const_double> *)(pLVar116 + -2))->p;
                          dVar206 = (double)pLVar116[-1];
                          dVar211 = (double)*pLVar116;
                          dVar187 = adStack_3b8[lVar140];
                          dVar198 = dVar198 + dVar206 * (double)pLVar116[-1];
                          dVar200 = dVar200 + (double)pdVar114 * (double)*pLVar116;
                          dVar205 = dVar205 + dVar211 * dVar211;
                          dVar213 = dVar213 + dVar187 * (double)pdVar114;
                          dVar214 = dVar214 + (double)pdVar114 * (double)pdVar114;
                          dVar184 = dVar184 + dVar187 * dVar206;
                          dVar186 = dVar186 + dVar206 * (double)pdVar114;
                          dVar188 = dVar188 + dVar211 * (double)pLVar116[-1];
                          dVar190 = dVar190 + dVar187 * (double)*pLVar116;
                          lVar140 = lVar140 + 1;
                          pLVar116 = pLVar116 + 3;
                        } while (lVar140 != 0x1b);
                        dVar211 = dVar186 * dVar205 - dVar200 * dVar188;
                        dVar187 = dVar186 * dVar190 - dVar200 * dVar184;
                        dVar208 = dVar186 * dVar188 + dVar200 * -dVar198;
                        dVar206 = dVar205 * dVar198 - dVar188 * dVar188;
                        dVar205 = dVar205 * dVar184 - dVar188 * dVar190;
                        auVar195._0_8_ =
                             dVar200 * (dVar184 * dVar188 - dVar190 * dVar198) +
                             (dVar213 * dVar206 - dVar205 * dVar186);
                        auVar195._8_8_ = dVar200 * dVar187 + (dVar214 * dVar205 - dVar211 * dVar213)
                        ;
                        dVar200 = dVar208 * dVar200 + (dVar206 * dVar214 - dVar211 * dVar186);
                        auVar196._8_8_ = dVar200;
                        auVar196._0_8_ = dVar200;
                        auVar196 = divpd(auVar195,auVar196);
                        dVar200 = (dVar208 * dVar213 +
                                  ((dVar190 * dVar198 + -dVar184 * dVar188) * dVar214 -
                                  dVar187 * dVar186)) / dVar200;
                        dVar186 = auVar196._0_8_;
                        dVar188 = auVar196._8_8_;
                        if ((dVar194 == 1.0) && (!NAN(dVar194))) {
                          if ((pdVar55[lVar99 + lVar126 + (lVar2 - lVar179)] == 1.0) &&
                             (!NAN(pdVar55[lVar99 + lVar126 + (lVar2 - lVar179)]))) {
                            if ((pdVar55[lVar99 + lVar126 + ((lVar112 + 1) - lVar179)] == 1.0) &&
                               (!NAN(pdVar55[lVar99 + lVar126 + ((lVar112 + 1) - lVar179)]))) {
                              dVar198 = pdVar35[lVar104 + lVar129 + lVar125 + ((lVar112 + 1) -
                                                                              lVar147)] - dVar193;
                              dVar190 = (dVar193 - dVar209) + (dVar193 - dVar209);
                              dVar198 = dVar198 + dVar198;
                              dVar184 = (pdVar35[lVar104 + lVar129 + lVar125 + ((lVar112 + 1) -
                                                                               lVar147)] - dVar209)
                                        * 0.5;
                              dVar205 = ABS(dVar190);
                              uVar182 = -(ulong)(0.0 < dVar184);
                              dVar184 = ABS(dVar184);
                              dVar186 = ABS(dVar198);
                              if (dVar205 <= dVar184) {
                                dVar184 = dVar205;
                              }
                              if (dVar184 <= dVar186) {
                                dVar186 = dVar184;
                              }
                              uVar189 = -(ulong)(0.0 < dVar190 * dVar198) & (ulong)dVar186;
                              dVar186 = (double)(~uVar182 & (uVar189 ^ 0x8000000000000000) |
                                                uVar182 & uVar189);
                            }
                          }
                          if ((((pdVar55[lVar126 + lVar136 + lVar139] == 1.0) &&
                               (!NAN(pdVar55[lVar126 + lVar136 + lVar139]))) &&
                              (pdVar55[lVar126 + lVar137 + lVar139] == 1.0)) &&
                             (!NAN(pdVar55[lVar126 + lVar137 + lVar139]))) {
                            dVar198 = dVar193 - pdVar35[lVar125 + lVar129 + lVar105 + lVar113];
                            dVar205 = pdVar35[lVar125 + lVar129 + lVar106 + lVar113] - dVar193;
                            dVar198 = dVar198 + dVar198;
                            dVar205 = dVar205 + dVar205;
                            dVar188 = (pdVar35[lVar125 + lVar129 + lVar106 + lVar113] -
                                      pdVar35[lVar125 + lVar129 + lVar105 + lVar113]) * 0.5;
                            dVar190 = ABS(dVar198);
                            uVar182 = -(ulong)(0.0 < dVar188);
                            dVar188 = ABS(dVar188);
                            dVar184 = ABS(dVar205);
                            if (dVar190 <= dVar188) {
                              dVar188 = dVar190;
                            }
                            if (dVar188 <= dVar184) {
                              dVar184 = dVar188;
                            }
                            uVar189 = -(ulong)(0.0 < dVar198 * dVar205) & (ulong)dVar184;
                            dVar188 = (double)(~uVar182 & (uVar189 ^ 0x8000000000000000) |
                                              uVar182 & uVar189);
                          }
                          if (((pdVar55[lVar99 + lVar139 + lVar130] == 1.0) &&
                              (!NAN(pdVar55[lVar99 + lVar139 + lVar130]))) &&
                             ((pdVar55[lVar99 + lVar139 + lVar131] == 1.0 &&
                              (!NAN(pdVar55[lVar99 + lVar139 + lVar131]))))) {
                            dVar200 = dVar193 - pdVar35[lVar104 + lVar113 + lVar151 + lVar125];
                            dVar205 = pdVar35[lVar104 + lVar113 + lVar132 + lVar125] - dVar193;
                            dVar200 = dVar200 + dVar200;
                            dVar205 = dVar205 + dVar205;
                            dVar184 = (pdVar35[lVar104 + lVar113 + lVar132 + lVar125] -
                                      pdVar35[lVar104 + lVar113 + lVar151 + lVar125]) * 0.5;
                            dVar198 = ABS(dVar200);
                            uVar182 = -(ulong)(0.0 < dVar184);
                            dVar184 = ABS(dVar184);
                            dVar190 = ABS(dVar205);
                            if (dVar198 <= dVar184) {
                              dVar184 = dVar198;
                            }
                            if (dVar184 <= dVar190) {
                              dVar190 = dVar184;
                            }
                            uVar189 = -(ulong)(0.0 < dVar200 * dVar205) & (ulong)dVar190;
                            dVar200 = (double)(~uVar182 & (uVar189 ^ 0x8000000000000000) |
                                              uVar182 & uVar189);
                          }
                        }
                        dVar184 = dVar209;
                        if (dVar193 <= dVar209) {
                          dVar184 = dVar193;
                        }
                        if (dVar209 <= dVar193) {
                          dVar209 = dVar193;
                        }
                        dVar212 = dVar212 - dVar207;
                        iVar120 = 0;
                        iVar161 = 0;
                        iVar143 = 0;
                        iVar144 = 0;
                        uVar155 = 0xffffffff;
                        do {
                          uVar121 = uVar155 + 1;
                          uVar90 = 0xffffffff;
                          iVar122 = iVar120;
                          do {
                            uVar1 = uVar90 + 1;
                            iVar166 = 5;
                            do {
                              if (((uVar32 >> (iVar122 + iVar166 & 0x1fU) & 1) != 0) &&
                                 ((iVar166 != 6 || uVar90 != 0) || uVar155 != 0)) {
                                iVar161 = iVar161 + (uint)((iVar166 - 5U & 0xfffffffd) == 0 &&
                                                          (uVar90 == 0 && uVar155 == 0));
                                iVar143 = iVar143 + (uint)((iVar166 == 6 && uVar155 == 0) &&
                                                          (uVar1 & 0xfffffffd) == 0);
                                iVar144 = iVar144 + (uint)((iVar166 == 6 && uVar90 == 0) &&
                                                          (uVar121 & 0xfffffffd) == 0);
                              }
                              iVar166 = iVar166 + 1;
                            } while (iVar166 != 8);
                            iVar122 = iVar122 + 3;
                            uVar90 = uVar1;
                          } while (uVar1 != 2);
                          iVar120 = iVar120 + 9;
                          uVar155 = uVar121;
                        } while (uVar121 != 2);
                        dVar190 = 2.0;
                        if ((uVar32 >> 0x15 & 1) != 0) {
                          lVar113 = -1;
                          cVar154 = '\b';
                          dVar190 = dVar193;
                          dVar198 = dVar193;
                          do {
                            iVar120 = 0;
                            bVar181 = true;
                            do {
                              bVar150 = bVar181;
                              lVar140 = 0;
                              do {
                                if (((int)lVar140 != 1 || (iVar120 != 0 || (int)lVar113 != 0)) &&
                                   ((1 << ((char)iVar120 * '\x03' + cVar154 + (char)lVar140 & 0x1fU)
                                    & uVar32) != 0)) {
                                  dVar205 = pdVar35[lVar125 + (iVar119 + (int)lVar113) * lVar37 +
                                                              (iVar88 + iVar120) * lVar36 +
                                                              (long)(iVar163 + (int)lVar140)];
                                  uVar201 = SUB84(dVar205,0);
                                  uVar203 = (undefined4)((ulong)dVar205 >> 0x20);
                                  if (dVar205 <= dVar190) {
                                    uVar201 = SUB84(dVar190,0);
                                    uVar203 = (undefined4)((ulong)dVar190 >> 0x20);
                                  }
                                  dVar190 = (double)CONCAT44(uVar203,uVar201);
                                  if (dVar205 < dVar198) {
                                    dVar198 = dVar205;
                                  }
                                }
                                lVar140 = lVar140 + 1;
                              } while (lVar140 != 3);
                              iVar120 = 1;
                              bVar181 = false;
                            } while (bVar150);
                            lVar113 = lVar113 + 1;
                            cVar154 = cVar154 + '\t';
                          } while (lVar113 != 2);
                          dVar205 = (((pdVar62 + lVar133 + lVar107 + (lVar112 - lVar170))[lVar65] -
                                     dVar199) * dVar200 +
                                    (0.5 - dVar207) * dVar188 +
                                    (pdVar62[lVar133 + lVar107 + (lVar112 - lVar170)] - dVar191) *
                                    dVar186 + dVar193) - dVar193;
                          if (dVar205 <= 1e-13) {
                            dVar190 = 1.0;
                            if ((dVar205 < -1e-13) &&
                               (dVar190 = (dVar198 - dVar193) / dVar205, 1.0 <= dVar190)) {
                              dVar190 = 1.0;
                            }
                          }
                          else {
                            dVar190 = (dVar190 - dVar193) / dVar205;
                            if (1.0 <= dVar190) {
                              dVar190 = 1.0;
                            }
                          }
                          if (2.0 <= dVar190) {
                            dVar190 = 2.0;
                          }
                        }
                        dVar198 = dVar190;
                        if ((short)uVar32 < 0) {
                          lVar113 = -1;
                          cVar154 = '\x05';
                          dVar205 = dVar193;
                          dVar198 = dVar193;
                          do {
                            lVar140 = -1;
                            cVar162 = cVar154;
                            do {
                              lVar148 = 0;
                              dVar213 = dVar198;
                              do {
                                dVar198 = dVar213;
                                if (((int)lVar148 != 1 || ((int)lVar140 != 0 || (int)lVar113 != 0))
                                   && ((1 << (cVar162 + (char)lVar148 & 0x1fU) & uVar32) != 0)) {
                                  dVar214 = pdVar35[lVar125 + (iVar119 + (int)lVar113) * lVar37 +
                                                              (iVar88 + (int)lVar140) * lVar36 +
                                                              (long)(iVar163 + (int)lVar148)];
                                  dVar198 = dVar214;
                                  if (dVar214 <= dVar213) {
                                    dVar198 = dVar213;
                                  }
                                  if (dVar214 < dVar205) {
                                    dVar205 = dVar214;
                                  }
                                }
                                lVar148 = lVar148 + 1;
                                dVar213 = dVar198;
                              } while (lVar148 != 3);
                              cVar162 = cVar162 + '\x03';
                              bVar181 = lVar140 != 0;
                              lVar140 = lVar140 + 1;
                            } while (bVar181);
                            lVar113 = lVar113 + 1;
                            cVar154 = cVar154 + '\t';
                          } while (lVar113 != 2);
                          dVar213 = (((pdVar62 + lVar133 + lVar108 + (lVar112 - lVar170))[lVar65] -
                                     dVar199) * dVar200 +
                                    (((pdVar62[lVar133 + lVar108 + (lVar112 - lVar170)] - dVar191) *
                                      dVar186 + dVar193) - (dVar207 + 0.5) * dVar188)) - dVar193;
                          if (dVar213 <= 1e-13) {
                            dVar198 = 1.0;
                            if ((dVar213 < -1e-13) &&
                               (dVar198 = (dVar205 - dVar193) / dVar213, 1.0 <= dVar198)) {
                              dVar198 = 1.0;
                            }
                          }
                          else {
                            dVar198 = (dVar198 - dVar193) / dVar213;
                            if (1.0 <= dVar198) {
                              dVar198 = 1.0;
                            }
                          }
                          if (dVar190 <= dVar198) {
                            dVar198 = dVar190;
                          }
                        }
                        dVar190 = dVar198;
                        if ((uVar32 >> 0x13 & 1) != 0) {
                          lVar113 = -1;
                          dVar205 = dVar193;
                          dVar190 = dVar193;
                          do {
                            lVar140 = -1;
                            do {
                              iVar120 = 0;
                              bVar181 = true;
                              do {
                                bVar150 = bVar181;
                                if ((((int)lVar140 != 0 || (int)lVar113 != 0) || iVar120 != 0) &&
                                   ((1 << ((char)lVar140 * '\x03' + (char)lVar113 * '\t' + '\x12' +
                                           (char)iVar120 & 0x1fU) & uVar32) != 0)) {
                                  dVar213 = pdVar35[lVar125 + (iVar119 + (int)lVar113) * lVar37 +
                                                              (iVar88 + (int)lVar140) * lVar36 +
                                                              (long)(int)(iVar120 + (iVar89 - uVar8)
                                                                         )];
                                  dVar214 = dVar213;
                                  if (dVar213 <= dVar190) {
                                    dVar214 = dVar190;
                                  }
                                  dVar190 = dVar214;
                                  if (dVar213 < dVar205) {
                                    dVar205 = dVar213;
                                  }
                                }
                                iVar120 = 1;
                                bVar181 = false;
                              } while (bVar150);
                              lVar140 = lVar140 + 1;
                            } while (lVar140 != 2);
                            lVar113 = lVar113 + 1;
                          } while (lVar113 != 2);
                          dVar213 = (((pdVar58 + lVar127 + lVar102 + ((iVar89 - iVar20) + 1))
                                      [lVar61] - dVar199) * dVar200 +
                                    (pdVar58[lVar127 + lVar102 + ((iVar89 - iVar20) + 1)] - dVar207)
                                    * dVar188 + (0.5 - dVar191) * dVar186 + dVar193) - dVar193;
                          if (dVar213 <= 1e-13) {
                            dVar190 = 1.0;
                            if ((dVar213 < -1e-13) &&
                               (dVar190 = (dVar205 - dVar193) / dVar213, 1.0 <= dVar190)) {
                              dVar190 = 1.0;
                            }
                          }
                          else {
                            dVar190 = (dVar190 - dVar193) / dVar213;
                            if (1.0 <= dVar190) {
                              dVar190 = 1.0;
                            }
                          }
                          if (dVar198 <= dVar190) {
                            dVar190 = dVar198;
                          }
                        }
                        lVar113 = -1;
                        cVar154 = '\x05';
                        dVar198 = dVar193;
                        dVar205 = dVar193;
                        do {
                          lVar140 = -1;
                          cVar162 = cVar154;
                          do {
                            lVar148 = 0;
                            do {
                              if (((int)lVar148 != 1 || ((int)lVar140 != 0 || (int)lVar113 != 0)) &&
                                 ((1 << (cVar162 + (char)lVar148 & 0x1fU) & uVar32) != 0)) {
                                dVar213 = pdVar35[lVar125 + (iVar119 + (int)lVar113) * lVar37 +
                                                            (iVar88 + (int)lVar140) * lVar36 +
                                                            (long)(iVar163 + (int)lVar148)];
                                dVar214 = dVar213;
                                if (dVar213 <= dVar198) {
                                  dVar214 = dVar198;
                                }
                                dVar198 = dVar214;
                                if (dVar213 < dVar205) {
                                  dVar205 = dVar213;
                                }
                              }
                              lVar148 = lVar148 + 1;
                            } while (lVar148 != 2);
                            lVar140 = lVar140 + 1;
                            cVar162 = cVar162 + '\x03';
                          } while (lVar140 != 2);
                          lVar113 = lVar113 + 1;
                          cVar154 = cVar154 + '\t';
                        } while (lVar113 != 2);
                        dVar213 = (dVar197 * dVar200 +
                                  dVar212 * dVar188 + (dVar193 - (dVar191 + 0.5) * dVar186)) -
                                  dVar193;
                        if (dVar213 <= 1e-13) {
                          dVar198 = 1.0;
                          if ((dVar213 < -1e-13) &&
                             (dVar198 = (dVar205 - dVar193) / dVar213, 1.0 <= dVar198)) {
                            dVar198 = 1.0;
                          }
                        }
                        else {
                          dVar198 = (dVar198 - dVar193) / dVar213;
                          if (1.0 <= dVar198) {
                            dVar198 = 1.0;
                          }
                        }
                        if (dVar190 <= dVar198) {
                          dVar198 = dVar190;
                        }
                        dVar190 = dVar198;
                        if ((uVar32 >> 0x1b & 1) != 0) {
                          iVar120 = 0;
                          dVar205 = dVar193;
                          bVar181 = true;
                          dVar190 = dVar193;
                          do {
                            bVar150 = bVar181;
                            iVar122 = iVar120 * 9 + 0xe;
                            lVar113 = -1;
                            do {
                              lVar140 = 0;
                              do {
                                if (((int)lVar140 != 1 || ((int)lVar113 != 0 || iVar120 != 0)) &&
                                   ((1 << ((char)iVar122 + (char)lVar140 & 0x1fU) & uVar32) != 0)) {
                                  dVar213 = pdVar35[lVar125 + (iVar119 + iVar120) * lVar37 +
                                                              (iVar88 + (int)lVar113) * lVar36 +
                                                              (long)(iVar163 + (int)lVar140)];
                                  dVar214 = dVar213;
                                  if (dVar213 <= dVar190) {
                                    dVar214 = dVar190;
                                  }
                                  dVar190 = dVar214;
                                  if (dVar213 < dVar205) {
                                    dVar205 = dVar213;
                                  }
                                }
                                lVar140 = lVar140 + 1;
                              } while (lVar140 != 3);
                              lVar113 = lVar113 + 1;
                              iVar122 = iVar122 + 3;
                            } while (lVar113 != 2);
                            iVar120 = 1;
                            bVar181 = false;
                          } while (bVar150);
                          dVar213 = ((0.5 - dVar199) * dVar200 +
                                    ((pdVar66 + lVar109 + lVar157 + (lVar112 - lVar171))[lVar69] -
                                    dVar207) * dVar188 +
                                    (pdVar66[lVar109 + lVar157 + (lVar112 - lVar171)] - dVar191) *
                                    dVar186 + dVar193) - dVar193;
                          if (dVar213 <= 1e-13) {
                            dVar190 = 1.0;
                            if (dVar213 < -1e-13) {
                              dVar190 = (dVar205 - dVar193) / dVar213;
                              if (1.0 <= dVar190) {
                                dVar190 = 1.0;
                              }
                            }
                          }
                          else {
                            dVar190 = (dVar190 - dVar193) / dVar213;
                            if (1.0 <= dVar190) {
                              dVar190 = 1.0;
                            }
                          }
                          if (dVar198 <= dVar190) {
                            dVar190 = dVar198;
                          }
                        }
                        dVar198 = dVar190;
                        if ((uVar32 >> 9 & 1) != 0) {
                          cVar154 = '\x05';
                          lVar113 = -1;
                          dVar205 = dVar193;
                          dVar198 = dVar193;
                          do {
                            lVar140 = -1;
                            cVar162 = cVar154;
                            do {
                              lVar148 = 0;
                              do {
                                if (((int)lVar148 != 1 || ((int)lVar140 != 0 || (int)lVar113 != 0))
                                   && ((1 << (cVar162 + (char)lVar148 & 0x1fU) & uVar32) != 0)) {
                                  dVar213 = pdVar35[lVar125 + (iVar119 + (int)lVar113) * lVar37 +
                                                              (iVar88 + (int)lVar140) * lVar36 +
                                                              (long)(iVar163 + (int)lVar148)];
                                  dVar214 = dVar213;
                                  if (dVar213 <= dVar198) {
                                    dVar214 = dVar198;
                                  }
                                  dVar198 = dVar214;
                                  if (dVar213 < dVar205) {
                                    dVar205 = dVar213;
                                  }
                                }
                                lVar148 = lVar148 + 1;
                              } while (lVar148 != 3);
                              lVar140 = lVar140 + 1;
                              cVar162 = cVar162 + '\x03';
                            } while (lVar140 != 2);
                            cVar154 = cVar154 + '\t';
                            bVar181 = lVar113 != 0;
                            lVar113 = lVar113 + 1;
                          } while (bVar181);
                          dVar207 = ((((pdVar66 + lVar109 + lVar158 + (lVar112 - lVar171))[lVar69] -
                                      dVar207) * dVar188 +
                                     (pdVar66[lVar109 + lVar158 + (lVar112 - lVar171)] - dVar191) *
                                     dVar186 + dVar193) - (dVar199 + 0.5) * dVar200) - dVar193;
                          if (dVar207 <= 1e-13) {
                            dVar198 = 1.0;
                            if ((dVar207 < -1e-13) &&
                               (dVar198 = (dVar205 - dVar193) / dVar207, 1.0 <= dVar198)) {
                              dVar198 = 1.0;
                            }
                          }
                          else {
                            dVar198 = (dVar198 - dVar193) / dVar207;
                            if (1.0 <= dVar198) {
                              dVar198 = 1.0;
                            }
                          }
                          if (dVar190 <= dVar198) {
                            dVar198 = dVar190;
                          }
                        }
                        uVar201 = 0;
                        uVar203 = 0;
                        dVar207 = 0.0;
                        if (1 < iVar161) {
                          dVar207 = dVar198;
                        }
                        dVar199 = 0.0;
                        if (1 < iVar143) {
                          dVar199 = dVar198;
                        }
                        if (1 < iVar144) {
                          uVar201 = SUB84(dVar198,0);
                          uVar203 = (undefined4)((ulong)dVar198 >> 0x20);
                        }
                        local_970 = lVar2 - lVar179;
                        dVar190 = pdVar55[lVar99 + lVar126 + local_970];
                        if ((dVar194 == 1.0) && (!NAN(dVar194))) {
                          if ((dVar190 == 1.0) &&
                             (((!NAN(dVar190) &&
                               (pdVar55[lVar99 + lVar126 + ((iVar89 - iVar17) + 1)] == 1.0)) &&
                              (!NAN(pdVar55[lVar99 + lVar126 + ((iVar89 - iVar17) + 1)]))))) {
                            dVar207 = 1.0;
                          }
                          if (((pdVar55[lVar126 + lVar110 + lVar139] == 1.0) &&
                              (!NAN(pdVar55[lVar126 + lVar110 + lVar139]))) &&
                             ((pdVar55[lVar126 + lVar111 + lVar139] == 1.0 &&
                              (!NAN(pdVar55[lVar126 + lVar111 + lVar139]))))) {
                            dVar199 = 1.0;
                          }
                          if (((pdVar55[lVar99 + lVar139 + lVar134] == 1.0) &&
                              (!NAN(pdVar55[lVar99 + lVar139 + lVar134]))) &&
                             ((pdVar55[lVar99 + lVar139 + lVar135] == 1.0 &&
                              (!NAN(pdVar55[lVar99 + lVar139 + lVar135]))))) {
                            uVar201 = 0;
                            uVar203 = 0x3ff00000;
                          }
                        }
                        dVar212 = dVar197 * dVar200 * (double)CONCAT44(uVar203,uVar201) +
                                  dVar212 * dVar188 * dVar199 +
                                  (-0.5 - dVar191) * dVar186 * dVar207 + dVar193;
                        if (dVar212 <= dVar209) {
                          dVar209 = dVar212;
                        }
                        if (dVar184 <= dVar209) {
                          dVar184 = dVar209;
                        }
                        dVar184 = pdVar39[lVar180 + lVar101 + (lVar112 - lVar149)] * dVar183 * -0.5
                                  * dVar186 * dVar207 + dVar184;
                        local_888 = pdVar55 + lVar99 + local_970;
                        if ((dVar190 == 1.0) && (!NAN(dVar190))) goto LAB_0031220c;
                        bVar181 = false;
LAB_003125e8:
                        dVar197 = pdVar58[lVar127 + lVar102 + (lVar112 - lVar169)];
                        dVar191 = (pdVar58 + lVar127 + lVar102 + (lVar112 - lVar169))[lVar61];
                        pdVar114 = pdVar34 + (iVar173 - iVar16) * lVar54 +
                                             (iVar176 - iVar15) * lVar53 +
                                             (long)((int)lVar2 - iVar177);
                        dVar207 = *pdVar114;
                        dVar199 = pdVar114[lVar33];
                        dVar193 = pdVar114[lVar33 * 2];
                        iVar144 = (int)lVar2 - uVar8;
                        lVar139 = (long)iVar144;
                        dVar209 = pdVar35[lVar104 + lVar129 + lVar125 + (lVar112 - lVar147)];
                        dVar186 = pdVar35[lVar104 + lVar139 + lVar129 + lVar125];
                        uVar32 = pEVar50[lVar94 + lVar98 + (lVar2 - lVar156)].flag;
                        lVar113 = -1;
                        cVar154 = '\x05';
                        lVar140 = 0;
                        do {
                          iVar120 = (int)lVar113;
                          lVar148 = -1;
                          cVar162 = cVar154;
                          do {
                            iVar143 = (int)lVar148;
                            iVar161 = (int)lVar140;
                            ppdVar164 = &local_2d8.q.p + (long)iVar161 * 3;
                            lVar140 = 0;
                            do {
                              iVar122 = (int)lVar140 + -1;
                              if (((iVar143 == 0 && iVar120 == 0) && iVar122 == 0) ||
                                 ((1 << (cVar162 + (char)lVar140 & 0x1fU) & uVar32) == 0)) {
                                *ppdVar164 = (double *)0x0;
                                ppdVar164[1] = (double *)0x0;
                                ppdVar164[2] = (double *)0x0;
                              }
                              else {
                                pdVar114 = pdVar34 + ((iVar173 - iVar16) + iVar120) * lVar54 +
                                                     ((iVar176 - iVar15) + iVar143) * lVar53 +
                                                     (long)(iVar84 + (int)lVar140);
                                dVar212 = (pdVar114[lVar33] + (double)iVar143) - dVar199;
                                auVar70._8_4_ = SUB84(dVar212,0);
                                auVar70._0_8_ = (*pdVar114 + (double)iVar122) - dVar207;
                                auVar70._12_4_ = (int)((ulong)dVar212 >> 0x20);
                                *(undefined1 (*) [16])ppdVar164 = auVar70;
                                ppdVar164[2] = (double *)
                                               ((pdVar114[lVar33 * 2] + (double)iVar120) - dVar193);
                              }
                              lVar140 = lVar140 + 1;
                              ppdVar164 = ppdVar164 + 3;
                            } while (lVar140 != 3);
                            lVar148 = lVar148 + 1;
                            cVar162 = cVar162 + '\x03';
                            lVar140 = (long)iVar161 + 3;
                          } while (lVar148 != 2);
                          lVar113 = lVar113 + 1;
                          cVar154 = cVar154 + '\t';
                          lVar140 = (long)iVar161 + 3;
                        } while (lVar113 != 2);
                        lVar113 = -1;
                        bVar172 = 5;
                        lVar140 = 0;
                        do {
                          lVar148 = -1;
                          bVar142 = bVar172;
                          do {
                            lVar140 = (long)(int)lVar140;
                            lVar115 = 3;
                            iVar143 = -1;
                            iVar120 = iVar3;
                            bVar118 = bVar142;
                            do {
                              dVar212 = 0.0;
                              if ((((int)lVar148 != 0 || (int)lVar113 != 0) || iVar143 != 0) &&
                                 ((1 << (bVar118 & 0x1f) & uVar32) != 0)) {
                                dVar212 = pdVar35[lVar125 + (iVar119 + (int)lVar113) * lVar37 +
                                                            (iVar88 + (int)lVar148) * lVar36 +
                                                            (long)iVar120] - dVar186;
                              }
                              adStack_3b8[lVar140] = dVar212;
                              lVar140 = lVar140 + 1;
                              iVar120 = iVar120 + 1;
                              iVar143 = iVar143 + 1;
                              bVar118 = bVar118 + 1;
                              lVar115 = lVar115 + -1;
                            } while (lVar115 != 0);
                            lVar148 = lVar148 + 1;
                            bVar142 = bVar142 + 3;
                          } while (lVar148 != 2);
                          lVar113 = lVar113 + 1;
                          bVar172 = bVar172 + 9;
                        } while (lVar113 != 2);
                        dVar191 = dVar191 - dVar193;
                        dVar188 = 0.0;
                        dVar190 = 0.0;
                        dVar212 = 0.0;
                        pLVar116 = &local_2d8.q.kstride;
                        lVar113 = 0;
                        dVar198 = 0.0;
                        dVar200 = 0.0;
                        dVar214 = 0.0;
                        dVar211 = 0.0;
                        dVar205 = 0.0;
                        dVar213 = 0.0;
                        do {
                          pdVar114 = ((Array4<const_double> *)(pLVar116 + -2))->p;
                          dVar208 = (double)pLVar116[-1];
                          dVar187 = (double)*pLVar116;
                          dVar206 = adStack_3b8[lVar113];
                          dVar205 = dVar205 + dVar208 * (double)pLVar116[-1];
                          dVar213 = dVar213 + (double)pdVar114 * (double)*pLVar116;
                          dVar212 = dVar212 + dVar187 * dVar187;
                          dVar214 = dVar214 + dVar206 * (double)pdVar114;
                          dVar211 = dVar211 + (double)pdVar114 * (double)pdVar114;
                          dVar188 = dVar188 + dVar206 * dVar208;
                          dVar190 = dVar190 + dVar208 * (double)pdVar114;
                          dVar198 = dVar198 + dVar187 * (double)pLVar116[-1];
                          dVar200 = dVar200 + dVar206 * (double)*pLVar116;
                          lVar113 = lVar113 + 1;
                          pLVar116 = pLVar116 + 3;
                        } while (lVar113 != 0x1b);
                        dVar208 = dVar190 * dVar212 - dVar213 * dVar198;
                        dVar206 = dVar190 * dVar200 - dVar213 * dVar188;
                        dVar210 = dVar190 * dVar198 + dVar213 * -dVar205;
                        dVar187 = dVar212 * dVar205 - dVar198 * dVar198;
                        dVar212 = dVar212 * dVar188 - dVar198 * dVar200;
                        auVar192._0_8_ =
                             dVar213 * (dVar188 * dVar198 - dVar200 * dVar205) +
                             (dVar214 * dVar187 - dVar212 * dVar190);
                        auVar192._8_8_ = dVar213 * dVar206 + (dVar211 * dVar212 - dVar208 * dVar214)
                        ;
                        dVar213 = dVar210 * dVar213 + (dVar187 * dVar211 - dVar208 * dVar190);
                        auVar185._8_8_ = dVar213;
                        auVar185._0_8_ = dVar213;
                        auVar196 = divpd(auVar192,auVar185);
                        dVar213 = (dVar210 * dVar214 +
                                  ((dVar200 * dVar205 + -dVar188 * dVar198) * dVar211 -
                                  dVar206 * dVar190)) / dVar213;
                        dVar188 = auVar196._0_8_;
                        dVar190 = auVar196._8_8_;
                        if (bVar181) {
                          if ((dVar194 == 1.0) && (!NAN(dVar194))) {
                            if ((pdVar55[lVar99 + lVar126 + ((lVar112 + -2) - lVar179)] == 1.0) &&
                               (!NAN(pdVar55[lVar99 + lVar126 + ((lVar112 + -2) - lVar179)]))) {
                              dVar200 = dVar186 - pdVar35[lVar104 + lVar129 + lVar125 + ((lVar112 +
                                                                                         -2) - 
                                                  lVar147)];
                              dVar198 = (dVar209 - dVar186) + (dVar209 - dVar186);
                              dVar200 = dVar200 + dVar200;
                              dVar212 = (dVar209 -
                                        pdVar35[lVar104 + lVar129 + lVar125 + ((lVar112 + -2) -
                                                                              lVar147)]) * 0.5;
                              dVar205 = ABS(dVar200);
                              uVar182 = -(ulong)(0.0 < dVar212);
                              dVar212 = ABS(dVar212);
                              dVar188 = ABS(dVar198);
                              if (dVar205 <= dVar212) {
                                dVar212 = dVar205;
                              }
                              if (dVar212 <= dVar188) {
                                dVar188 = dVar212;
                              }
                              uVar189 = -(ulong)(0.0 < dVar200 * dVar198) & (ulong)dVar188;
                              dVar188 = (double)(~uVar182 & (uVar189 ^ 0x8000000000000000) |
                                                uVar182 & uVar189);
                            }
                          }
                          if ((((pdVar55[lVar126 + lVar136 + local_970] == 1.0) &&
                               (!NAN(pdVar55[lVar126 + lVar136 + local_970]))) &&
                              (pdVar55[lVar126 + lVar137 + local_970] == 1.0)) &&
                             (!NAN(pdVar55[lVar126 + lVar137 + local_970]))) {
                            dVar212 = dVar186 - pdVar35[lVar125 + lVar129 + lVar105 + lVar139];
                            dVar190 = pdVar35[lVar125 + lVar129 + lVar106 + lVar139] - dVar186;
                            dVar212 = dVar212 + dVar212;
                            dVar190 = dVar190 + dVar190;
                            dVar200 = (pdVar35[lVar125 + lVar129 + lVar106 + lVar139] -
                                      pdVar35[lVar125 + lVar129 + lVar105 + lVar139]) * 0.5;
                            dVar205 = ABS(dVar212);
                            uVar182 = -(ulong)(0.0 < dVar200);
                            dVar200 = ABS(dVar200);
                            dVar198 = ABS(dVar190);
                            if (dVar205 <= dVar200) {
                              dVar200 = dVar205;
                            }
                            if (dVar200 <= dVar198) {
                              dVar198 = dVar200;
                            }
                            uVar189 = -(ulong)(0.0 < dVar212 * dVar190) & (ulong)dVar198;
                            dVar190 = (double)(~uVar182 & (uVar189 ^ 0x8000000000000000) |
                                              uVar182 & uVar189);
                          }
                          if (((local_888[lVar130] == 1.0) && (!NAN(local_888[lVar130]))) &&
                             ((local_888[lVar131] == 1.0 && (!NAN(local_888[lVar131]))))) {
                            dVar205 = dVar186 - pdVar35[lVar104 + lVar139 + lVar151 + lVar125];
                            dVar213 = pdVar35[lVar104 + lVar139 + lVar132 + lVar125] - dVar186;
                            dVar205 = dVar205 + dVar205;
                            dVar213 = dVar213 + dVar213;
                            dVar198 = (pdVar35[lVar104 + lVar139 + lVar132 + lVar125] -
                                      pdVar35[lVar104 + lVar139 + lVar151 + lVar125]) * 0.5;
                            dVar200 = ABS(dVar205);
                            uVar182 = -(ulong)(0.0 < dVar198);
                            dVar198 = ABS(dVar198);
                            dVar212 = ABS(dVar213);
                            if (dVar200 <= dVar198) {
                              dVar198 = dVar200;
                            }
                            if (dVar198 <= dVar212) {
                              dVar212 = dVar198;
                            }
                            uVar189 = -(ulong)(0.0 < dVar205 * dVar213) & (ulong)dVar212;
                            dVar213 = (double)(~uVar182 & (uVar189 ^ 0x8000000000000000) |
                                              uVar182 & uVar189);
                          }
                        }
                        dVar212 = dVar186;
                        if (dVar209 <= dVar186) {
                          dVar212 = dVar209;
                        }
                        dVar198 = dVar186;
                        if (dVar186 <= dVar209) {
                          dVar198 = dVar209;
                        }
                        dVar197 = dVar197 - dVar199;
                        iVar143 = 0;
                        iVar120 = 0;
                        iVar122 = 0;
                        iVar161 = 0;
                        uVar155 = 0xffffffff;
                        do {
                          uVar121 = uVar155 + 1;
                          uVar90 = 0xffffffff;
                          iVar166 = iVar143;
                          do {
                            uVar1 = uVar90 + 1;
                            iVar167 = 5;
                            do {
                              if (((uVar32 >> (iVar166 + iVar167 & 0x1fU) & 1) != 0) &&
                                 ((iVar167 != 6 || uVar90 != 0) || uVar155 != 0)) {
                                iVar120 = iVar120 + (uint)((iVar167 - 5U & 0xfffffffd) == 0 &&
                                                          (uVar90 == 0 && uVar155 == 0));
                                iVar122 = iVar122 + (uint)((iVar167 == 6 && uVar155 == 0) &&
                                                          (uVar1 & 0xfffffffd) == 0);
                                iVar161 = iVar161 + (uint)((iVar167 == 6 && uVar90 == 0) &&
                                                          (uVar121 & 0xfffffffd) == 0);
                              }
                              iVar167 = iVar167 + 1;
                            } while (iVar167 != 8);
                            iVar166 = iVar166 + 3;
                            uVar90 = uVar1;
                          } while (uVar1 != 2);
                          iVar143 = iVar143 + 9;
                          uVar155 = uVar121;
                        } while (uVar121 != 2);
                        dVar209 = 2.0;
                        if ((uVar32 >> 0x15 & 1) != 0) {
                          lVar139 = -1;
                          cVar154 = '\b';
                          dVar200 = dVar186;
                          dVar209 = dVar186;
                          do {
                            iVar143 = 0;
                            bVar181 = true;
                            do {
                              bVar150 = bVar181;
                              lVar113 = 0;
                              dVar205 = dVar209;
                              do {
                                dVar209 = dVar205;
                                if (((int)lVar113 != 1 || (iVar143 != 0 || (int)lVar139 != 0)) &&
                                   ((1 << ((char)iVar143 * '\x03' + cVar154 + (char)lVar113 & 0x1fU)
                                    & uVar32) != 0)) {
                                  dVar214 = pdVar35[lVar125 + (iVar119 + (int)lVar139) * lVar37 +
                                                              (iVar88 + iVar143) * lVar36 +
                                                              (long)(iVar3 + (int)lVar113)];
                                  dVar209 = dVar214;
                                  if (dVar214 <= dVar205) {
                                    dVar209 = dVar205;
                                  }
                                  if (dVar214 < dVar200) {
                                    dVar200 = dVar214;
                                  }
                                }
                                lVar113 = lVar113 + 1;
                                dVar205 = dVar209;
                              } while (lVar113 != 3);
                              iVar143 = 1;
                              bVar181 = false;
                            } while (bVar150);
                            lVar139 = lVar139 + 1;
                            cVar154 = cVar154 + '\t';
                          } while (lVar139 != 2);
                          dVar205 = (((pdVar62 + lVar133 + lVar107 + (lVar2 - lVar170))[lVar65] -
                                     dVar193) * dVar213 +
                                    (0.5 - dVar199) * dVar190 +
                                    (pdVar62[lVar133 + lVar107 + (lVar2 - lVar170)] - dVar207) *
                                    dVar188 + dVar186) - dVar186;
                          if (dVar205 <= 1e-13) {
                            dVar209 = 1.0;
                            if ((dVar205 < -1e-13) &&
                               (dVar209 = (dVar200 - dVar186) / dVar205, 1.0 <= dVar209)) {
                              dVar209 = 1.0;
                            }
                          }
                          else {
                            dVar209 = (dVar209 - dVar186) / dVar205;
                            if (1.0 <= dVar209) {
                              dVar209 = 1.0;
                            }
                          }
                          if (2.0 <= dVar209) {
                            dVar209 = 2.0;
                          }
                        }
                        uVar201 = SUB84(dVar186,0);
                        uVar203 = (undefined4)((ulong)dVar186 >> 0x20);
                        dVar200 = dVar209;
                        if ((short)uVar32 < 0) {
                          lVar113 = -1;
                          cVar154 = '\x05';
                          lVar139 = lVar138;
                          uVar202 = uVar201;
                          uVar204 = uVar203;
                          dVar205 = dVar186;
                          do {
                            lVar140 = -1;
                            lVar148 = lVar139;
                            cVar162 = cVar154;
                            do {
                              lVar115 = 0;
                              do {
                                if (((int)lVar115 != 1 || ((int)lVar140 != 0 || (int)lVar113 != 0))
                                   && ((1 << (cVar162 + (char)lVar115 & 0x1fU) & uVar32) != 0)) {
                                  dVar200 = *(double *)(lVar148 + lVar115 * 8);
                                  dVar214 = dVar200;
                                  if (dVar200 <= (double)CONCAT44(uVar204,uVar202)) {
                                    dVar214 = (double)CONCAT44(uVar204,uVar202);
                                  }
                                  uVar202 = SUB84(dVar214,0);
                                  uVar204 = (undefined4)((ulong)dVar214 >> 0x20);
                                  if (dVar200 < dVar205) {
                                    dVar205 = dVar200;
                                  }
                                }
                                lVar115 = lVar115 + 1;
                              } while (lVar115 != 3);
                              lVar148 = lVar148 + lVar36 * 8;
                              cVar162 = cVar162 + '\x03';
                              bVar181 = lVar140 != 0;
                              lVar140 = lVar140 + 1;
                            } while (bVar181);
                            lVar113 = lVar113 + 1;
                            lVar139 = lVar139 + lVar37 * 8;
                            cVar154 = cVar154 + '\t';
                          } while (lVar113 != 2);
                          dVar214 = (((pdVar62 + lVar133 + lVar108 + (lVar2 - lVar170))[lVar65] -
                                     dVar193) * dVar213 +
                                    (((pdVar62[lVar133 + lVar108 + (lVar2 - lVar170)] - dVar207) *
                                      dVar188 + dVar186) - (dVar199 + 0.5) * dVar190)) - dVar186;
                          if (dVar214 <= 1e-13) {
                            dVar200 = 1.0;
                            if (dVar214 < -1e-13) {
                              dVar200 = (dVar205 - dVar186) / dVar214;
                              if (1.0 <= dVar200) {
                                dVar200 = 1.0;
                              }
                            }
                          }
                          else {
                            dVar200 = ((double)CONCAT44(uVar204,uVar202) - dVar186) / dVar214;
                            if (1.0 <= dVar200) {
                              dVar200 = 1.0;
                            }
                          }
                          if (dVar209 <= dVar200) {
                            dVar200 = dVar209;
                          }
                        }
                        dVar209 = dVar200;
                        if ((uVar32 >> 0x13 & 1) != 0) {
                          lVar139 = -1;
                          uVar202 = uVar201;
                          uVar204 = uVar203;
                          dVar205 = dVar186;
                          do {
                            lVar113 = -1;
                            do {
                              iVar143 = 0;
                              bVar181 = true;
                              do {
                                bVar150 = bVar181;
                                if ((((int)lVar113 != 0 || (int)lVar139 != 0) || iVar143 != 0) &&
                                   ((1 << ((char)lVar113 * '\x03' + (char)lVar139 * '\t' + '\x12' +
                                           (char)iVar143 & 0x1fU) & uVar32) != 0)) {
                                  dVar209 = pdVar35[lVar125 + (iVar119 + (int)lVar139) * lVar37 +
                                                              (iVar88 + (int)lVar113) * lVar36 +
                                                              (long)(iVar143 + iVar144)];
                                  dVar214 = dVar209;
                                  if (dVar209 <= (double)CONCAT44(uVar204,uVar202)) {
                                    dVar214 = (double)CONCAT44(uVar204,uVar202);
                                  }
                                  if (dVar209 < dVar205) {
                                    dVar205 = dVar209;
                                  }
                                  uVar202 = SUB84(dVar214,0);
                                  uVar204 = (undefined4)((ulong)dVar214 >> 0x20);
                                }
                                iVar143 = 1;
                                bVar181 = false;
                              } while (bVar150);
                              lVar113 = lVar113 + 1;
                            } while (lVar113 != 2);
                            lVar139 = lVar139 + 1;
                          } while (lVar139 != 2);
                          dVar214 = (dVar191 * dVar213 +
                                    dVar197 * dVar190 + (0.5 - dVar207) * dVar188 + dVar186) -
                                    dVar186;
                          if (dVar214 <= 1e-13) {
                            dVar209 = 1.0;
                            if ((dVar214 < -1e-13) &&
                               (dVar209 = (dVar205 - dVar186) / dVar214, 1.0 <= dVar209)) {
                              dVar209 = 1.0;
                            }
                          }
                          else {
                            dVar209 = ((double)CONCAT44(uVar204,uVar202) - dVar186) / dVar214;
                            if (1.0 <= dVar209) {
                              dVar209 = 1.0;
                            }
                          }
                          if (dVar200 <= dVar209) {
                            dVar209 = dVar200;
                          }
                        }
                        dVar200 = dVar209;
                        if ((uVar32 >> 0x11 & 1) != 0) {
                          lVar139 = -1;
                          cVar154 = '\x05';
                          dVar200 = dVar186;
                          dVar205 = dVar186;
                          do {
                            lVar113 = -1;
                            cVar162 = cVar154;
                            do {
                              lVar140 = 0;
                              do {
                                if (((int)lVar140 != 1 || ((int)lVar113 != 0 || (int)lVar139 != 0))
                                   && ((1 << (cVar162 + (char)lVar140 & 0x1fU) & uVar32) != 0)) {
                                  dVar214 = pdVar35[lVar125 + (iVar119 + (int)lVar139) * lVar37 +
                                                              (iVar88 + (int)lVar113) * lVar36 +
                                                              (long)(iVar3 + (int)lVar140)];
                                  dVar211 = dVar214;
                                  if (dVar214 <= dVar200) {
                                    dVar211 = dVar200;
                                  }
                                  dVar200 = dVar211;
                                  if (dVar214 < dVar205) {
                                    dVar205 = dVar214;
                                  }
                                }
                                lVar140 = lVar140 + 1;
                              } while (lVar140 != 2);
                              lVar113 = lVar113 + 1;
                              cVar162 = cVar162 + '\x03';
                            } while (lVar113 != 2);
                            lVar139 = lVar139 + 1;
                            cVar154 = cVar154 + '\t';
                          } while (lVar139 != 2);
                          dVar214 = (((pdVar58 + lVar127 + lVar102 + (lVar2 - lVar169))[lVar61] -
                                     dVar193) * dVar213 +
                                    (pdVar58[lVar127 + lVar102 + (lVar2 - lVar169)] - dVar199) *
                                    dVar190 + (dVar186 - (dVar207 + 0.5) * dVar188)) - dVar186;
                          if (dVar214 <= 1e-13) {
                            dVar200 = 1.0;
                            if ((dVar214 < -1e-13) &&
                               (dVar200 = (dVar205 - dVar186) / dVar214, 1.0 <= dVar200)) {
                              dVar200 = 1.0;
                            }
                          }
                          else {
                            dVar200 = (dVar200 - dVar186) / dVar214;
                            if (1.0 <= dVar200) {
                              dVar200 = 1.0;
                            }
                          }
                          if (dVar209 <= dVar200) {
                            dVar200 = dVar209;
                          }
                        }
                        dVar209 = dVar200;
                        if ((uVar32 >> 0x1b & 1) != 0) {
                          iVar144 = 0;
                          dVar205 = dVar186;
                          bVar181 = true;
                          do {
                            bVar150 = bVar181;
                            iVar143 = iVar144 * 9 + 0xe;
                            lVar139 = -1;
                            do {
                              lVar113 = 0;
                              do {
                                if (((int)lVar113 != 1 || ((int)lVar139 != 0 || iVar144 != 0)) &&
                                   ((1 << ((char)iVar143 + (char)lVar113 & 0x1fU) & uVar32) != 0)) {
                                  dVar209 = pdVar35[lVar125 + (iVar119 + iVar144) * lVar37 +
                                                              (iVar88 + (int)lVar139) * lVar36 +
                                                              (long)(iVar3 + (int)lVar113)];
                                  dVar214 = dVar209;
                                  if (dVar209 <= (double)CONCAT44(uVar203,uVar201)) {
                                    dVar214 = (double)CONCAT44(uVar203,uVar201);
                                  }
                                  if (dVar209 < dVar205) {
                                    dVar205 = dVar209;
                                  }
                                  uVar201 = SUB84(dVar214,0);
                                  uVar203 = (undefined4)((ulong)dVar214 >> 0x20);
                                }
                                lVar113 = lVar113 + 1;
                              } while (lVar113 != 3);
                              lVar139 = lVar139 + 1;
                              iVar143 = iVar143 + 3;
                            } while (lVar139 != 2);
                            iVar144 = 1;
                            bVar181 = false;
                          } while (bVar150);
                          dVar214 = ((0.5 - dVar193) * dVar213 +
                                    ((pdVar66 + lVar109 + lVar157 + (lVar2 - lVar171))[lVar69] -
                                    dVar199) * dVar190 +
                                    (pdVar66[lVar109 + lVar157 + (lVar2 - lVar171)] - dVar207) *
                                    dVar188 + dVar186) - dVar186;
                          if (dVar214 <= 1e-13) {
                            dVar209 = 1.0;
                            if ((dVar214 < -1e-13) &&
                               (dVar209 = (dVar205 - dVar186) / dVar214, 1.0 <= dVar209)) {
                              dVar209 = 1.0;
                            }
                          }
                          else {
                            dVar209 = ((double)CONCAT44(uVar203,uVar201) - dVar186) / dVar214;
                            if (1.0 <= dVar209) {
                              dVar209 = 1.0;
                            }
                          }
                          if (dVar200 <= dVar209) {
                            dVar209 = dVar200;
                          }
                        }
                        dVar200 = dVar209;
                        if ((uVar32 >> 9 & 1) != 0) {
                          cVar154 = '\x05';
                          lVar139 = -1;
                          dVar200 = dVar186;
                          dVar205 = dVar186;
                          do {
                            lVar113 = -1;
                            cVar162 = cVar154;
                            do {
                              lVar140 = 0;
                              dVar214 = dVar200;
                              do {
                                dVar200 = dVar214;
                                if (((int)lVar140 != 1 || ((int)lVar113 != 0 || (int)lVar139 != 0))
                                   && ((1 << (cVar162 + (char)lVar140 & 0x1fU) & uVar32) != 0)) {
                                  dVar211 = pdVar35[lVar125 + (iVar119 + (int)lVar139) * lVar37 +
                                                              (iVar88 + (int)lVar113) * lVar36 +
                                                              (long)(iVar3 + (int)lVar140)];
                                  dVar200 = dVar211;
                                  if (dVar211 <= dVar214) {
                                    dVar200 = dVar214;
                                  }
                                  if (dVar211 < dVar205) {
                                    dVar205 = dVar211;
                                  }
                                }
                                lVar140 = lVar140 + 1;
                                dVar214 = dVar200;
                              } while (lVar140 != 3);
                              lVar113 = lVar113 + 1;
                              cVar162 = cVar162 + '\x03';
                            } while (lVar113 != 2);
                            cVar154 = cVar154 + '\t';
                            bVar181 = lVar139 != 0;
                            lVar139 = lVar139 + 1;
                          } while (bVar181);
                          dVar199 = ((((pdVar66 + lVar109 + lVar158 + (lVar2 - lVar171))[lVar69] -
                                      dVar199) * dVar190 +
                                     (pdVar66[lVar109 + lVar158 + (lVar2 - lVar171)] - dVar207) *
                                     dVar188 + dVar186) - (dVar193 + 0.5) * dVar213) - dVar186;
                          if (dVar199 <= 1e-13) {
                            dVar200 = 1.0;
                            if ((dVar199 < -1e-13) &&
                               (dVar200 = (dVar205 - dVar186) / dVar199, 1.0 <= dVar200)) {
                              dVar200 = 1.0;
                            }
                          }
                          else {
                            dVar200 = (dVar200 - dVar186) / dVar199;
                            if (1.0 <= dVar200) {
                              dVar200 = 1.0;
                            }
                          }
                          if (dVar209 <= dVar200) {
                            dVar200 = dVar209;
                          }
                        }
                        dVar199 = 0.0;
                        if (1 < iVar120) {
                          dVar199 = dVar200;
                        }
                        uVar201 = 0;
                        uVar203 = 0;
                        if (1 < iVar122) {
                          uVar201 = SUB84(dVar200,0);
                          uVar203 = (undefined4)((ulong)dVar200 >> 0x20);
                        }
                        dVar193 = 0.0;
                        if (1 < iVar161) {
                          dVar193 = dVar200;
                        }
                        lVar139 = lVar2 - lVar179;
                        if ((pdVar55[lVar99 + lVar139 + lVar126] == 1.0) &&
                           (!NAN(pdVar55[lVar99 + lVar139 + lVar126]))) {
                          if ((pdVar55[lVar126 + lVar110 + lVar139] == 1.0) &&
                             (((!NAN(pdVar55[lVar126 + lVar110 + lVar139]) &&
                               (pdVar55[lVar126 + lVar111 + lVar139] == 1.0)) &&
                              (!NAN(pdVar55[lVar126 + lVar111 + lVar139]))))) {
                            uVar201 = 0;
                            uVar203 = 0x3ff00000;
                          }
                          dVar199 = (double)(~-(ulong)(dVar194 == 1.0) & (ulong)dVar199 |
                                            (~-(ulong)(pdVar55[lVar99 + lVar126 + ((iVar89 - iVar17)
                                                                                  + -2)] == 1.0) &
                                             (ulong)dVar199 |
                                            -(ulong)(pdVar55[lVar99 + lVar126 + ((iVar89 - iVar17) +
                                                                                -2)] == 1.0) &
                                            0x3ff0000000000000) & -(ulong)(dVar194 == 1.0));
                          if (((pdVar55[lVar99 + lVar139 + lVar134] == 1.0) &&
                              (!NAN(pdVar55[lVar99 + lVar139 + lVar134]))) &&
                             ((pdVar55[lVar99 + lVar139 + lVar135] == 1.0 &&
                              (!NAN(pdVar55[lVar99 + lVar139 + lVar135]))))) {
                            dVar193 = 1.0;
                          }
                        }
                        dVar194 = dVar191 * dVar213 * dVar193 +
                                  dVar197 * dVar190 * (double)CONCAT44(uVar203,uVar201) +
                                  (0.5 - dVar207) * dVar188 * dVar199 + dVar186;
                        if (dVar194 <= dVar198) {
                          dVar198 = dVar194;
                        }
                        if (dVar212 <= dVar198) {
                          dVar212 = dVar198;
                        }
                        dVar212 = pdVar39[lVar180 + lVar101 + (lVar2 - lVar149)] * dVar183 * -0.5 *
                                  dVar188 * dVar199 + dVar212;
                      }
                      else {
                        local_970 = lVar2 - lVar179;
                        local_888 = pdVar55 + lVar99 + local_970;
                        if ((local_888[lVar126] != 1.0) || (NAN(local_888[lVar126])))
                        goto LAB_00310b2f;
                        dVar212 = pdVar55[lVar99 + lVar126 + lVar139 + 1];
                        if ((((pdVar55[lVar99 + lVar126 + ((lVar112 + -2) - lVar179)] != 1.0) ||
                             (NAN(pdVar55[lVar99 + lVar126 + ((lVar112 + -2) - lVar179)]))) ||
                            (dVar212 != 1.0)) || (NAN(dVar212))) {
                          if ((dVar212 != 1.0) || (NAN(dVar212))) goto LAB_00310b2f;
LAB_00312c06:
                          dVar184 = pdVar35[lVar125 + lVar95 + lVar100 + (lVar112 - lVar147)];
                          dVar212 = (pdVar35 + lVar125 + lVar95 + lVar100 + (lVar112 - lVar147))[1];
                          dVar207 = dVar184 - pdVar35[lVar125 + lVar95 + lVar100 + (lVar2 - lVar147)
                                                     ];
                          dVar199 = dVar212 - dVar184;
                          dVar207 = dVar207 + dVar207;
                          dVar199 = dVar199 + dVar199;
                          dVar212 = (dVar212 -
                                    pdVar35[lVar125 + lVar95 + lVar100 + (lVar2 - lVar147)]) * 0.5;
                          dVar191 = ABS(dVar207);
                          uVar182 = -(ulong)(0.0 < dVar212);
                          dVar212 = ABS(dVar212);
                          dVar197 = ABS(dVar199);
                          if (dVar191 <= dVar212) {
                            dVar212 = dVar191;
                          }
                          if (dVar212 <= dVar197) {
                            dVar197 = dVar212;
                          }
                          uVar189 = -(ulong)(0.0 < dVar207 * dVar199) & (ulong)dVar197;
                          dVar184 = (double)(~uVar182 & (uVar189 ^ 0x8000000000000000) |
                                            uVar182 & uVar189) *
                                    (-1.0 - pdVar39[lVar180 + lVar101 + (lVar112 - lVar149)] *
                                            dVar183) * 0.5 + dVar184;
                        }
                        else {
                          if ((pdVar55[lVar99 + lVar126 + ((lVar112 + 2) - lVar179)] != 1.0) ||
                             (NAN(pdVar55[lVar99 + lVar126 + ((lVar112 + 2) - lVar179)])))
                          goto LAB_00312c06;
                          dVar184 = pdVar35[lVar125 + lVar95 + lVar100 + (lVar112 - lVar147)];
                          dVar212 = (pdVar35 + lVar125 + lVar95 + lVar100 + (lVar112 - lVar147))[1];
                          dVar197 = (pdVar35 +
                                    lVar125 + lVar95 + lVar100 + ((lVar112 + -2) - lVar147))[1];
                          dVar199 = dVar197 - pdVar35[lVar125 + lVar95 + lVar100 + ((lVar112 + -2) -
                                                                                   lVar147)];
                          dVar197 = dVar184 - dVar197;
                          dVar207 = 0.0;
                          dVar191 = 0.0;
                          if (0.0 <= dVar197 * dVar199) {
                            dVar191 = ABS(dVar197);
                            if (ABS(dVar199) <= ABS(dVar197)) {
                              dVar191 = ABS(dVar199);
                            }
                            dVar191 = dVar191 + dVar191;
                          }
                          dVar209 = dVar212 - dVar184;
                          dVar212 = pdVar35[lVar125 + lVar95 + lVar100 + ((lVar112 + 2) - lVar147)]
                                    - dVar212;
                          dVar193 = (dVar209 + dVar212) * 0.5;
                          if (0.0 <= dVar212 * dVar209) {
                            dVar207 = ABS(dVar212);
                            if (ABS(dVar209) <= ABS(dVar212)) {
                              dVar207 = ABS(dVar209);
                            }
                            dVar207 = dVar207 + dVar207;
                          }
                          dVar186 = (dVar197 + dVar209) * 0.5;
                          dVar212 = 0.0;
                          if (0.0 <= dVar197 * dVar209) {
                            dVar212 = ABS(dVar209);
                            if (ABS(dVar197) <= ABS(dVar209)) {
                              dVar212 = ABS(dVar197);
                            }
                            dVar212 = dVar212 + dVar212;
                          }
                          dVar199 = (dVar197 + dVar199) * 0.5;
                          dVar197 = ABS(dVar199);
                          if (dVar191 <= dVar197) {
                            dVar197 = dVar191;
                          }
                          dVar191 = ABS(dVar193);
                          if (dVar207 <= dVar191) {
                            dVar191 = dVar207;
                          }
                          dVar197 = ABS(dVar186 * 1.3333333333333333 +
                                        (dVar191 * (double)((ulong)dVar193 & 0x8000000000000000 |
                                                           0x3ff0000000000000) +
                                        dVar197 * (double)((ulong)dVar199 & 0x8000000000000000 |
                                                          0x3ff0000000000000)) *
                                        -0.16666666666666666);
                          if (dVar212 <= dVar197) {
                            dVar197 = dVar212;
                          }
                          dVar184 = dVar197 * (double)((ulong)dVar186 & 0x8000000000000000 |
                                                      0x3ff0000000000000) *
                                    (-1.0 - pdVar39[lVar180 + lVar101 + (lVar112 - lVar149)] *
                                            dVar183) * 0.5 + dVar184;
                        }
LAB_0031220c:
                        iVar144 = iVar89 + -2;
                        dVar212 = pdVar55[lVar99 + lVar126 + (iVar144 - iVar17)];
                        if ((dVar212 != 1.0) || (NAN(dVar212))) {
LAB_00312497:
                          if ((((dVar194 != 1.0) || (NAN(dVar194))) || (dVar212 != 1.0)) ||
                             (NAN(dVar212))) {
LAB_003125b8:
                            bVar181 = true;
                            goto LAB_003125e8;
                          }
                        }
                        else {
                          if ((pdVar55[lVar99 + lVar126 + ((iVar89 + -3) - iVar17)] != 1.0) ||
                             (NAN(pdVar55[lVar99 + lVar126 + ((iVar89 + -3) - iVar17)])))
                          goto LAB_00312497;
                          if ((dVar194 != 1.0) || (NAN(dVar194))) goto LAB_003125b8;
                          if ((pdVar55[lVar99 + lVar126 + ((iVar89 + 1) - iVar17)] == 1.0) &&
                             (!NAN(pdVar55[lVar99 + lVar126 + ((iVar89 + 1) - iVar17)]))) {
                            dVar212 = pdVar35[lVar125 + lVar95 + lVar100 + (lVar2 - lVar147)];
                            dVar197 = (pdVar35 + lVar125 + lVar95 + lVar100 + (lVar2 - lVar147))[1];
                            dVar207 = dVar212 - pdVar35[lVar125 + lVar95 + lVar100 + (int)(iVar144 -
                                                                                          uVar8)];
                            dVar199 = pdVar35[lVar125 + lVar95 + lVar100 + (int)(iVar144 - uVar8)] -
                                      pdVar35[lVar125 + lVar95 + lVar100 + (int)((iVar89 + -3) -
                                                                                uVar8)];
                            dVar191 = 0.0;
                            dVar194 = 0.0;
                            if (0.0 <= dVar207 * dVar199) {
                              dVar194 = ABS(dVar207);
                              if (ABS(dVar199) <= ABS(dVar207)) {
                                dVar194 = ABS(dVar199);
                              }
                              dVar194 = dVar194 + dVar194;
                            }
                            dVar209 = dVar197 - dVar212;
                            dVar197 = pdVar35[lVar125 + lVar95 + lVar100 + (int)((iVar89 + 1) -
                                                                                uVar8)] - dVar197;
                            dVar193 = (dVar209 + dVar197) * 0.5;
                            if (0.0 <= dVar197 * dVar209) {
                              dVar191 = ABS(dVar197);
                              if (ABS(dVar209) <= ABS(dVar197)) {
                                dVar191 = ABS(dVar209);
                              }
                              dVar191 = dVar191 + dVar191;
                            }
                            dVar186 = (dVar207 + dVar209) * 0.5;
                            dVar197 = 0.0;
                            if (0.0 <= dVar207 * dVar209) {
                              dVar197 = ABS(dVar209);
                              if (ABS(dVar207) <= ABS(dVar209)) {
                                dVar197 = ABS(dVar207);
                              }
                              dVar197 = dVar197 + dVar197;
                            }
                            dVar199 = (dVar207 + dVar199) * 0.5;
                            dVar207 = ABS(dVar199);
                            if (dVar194 <= dVar207) {
                              dVar207 = dVar194;
                            }
                            dVar194 = ABS(dVar193);
                            if (dVar191 <= dVar194) {
                              dVar194 = dVar191;
                            }
                            dVar194 = ABS(dVar186 * 1.3333333333333333 +
                                          (dVar194 * (double)((ulong)dVar193 & 0x8000000000000000 |
                                                             0x3ff0000000000000) +
                                          dVar207 * (double)((ulong)dVar199 & 0x8000000000000000 |
                                                            0x3ff0000000000000)) *
                                          -0.16666666666666666);
                            if (dVar197 <= dVar194) {
                              dVar194 = dVar197;
                            }
                            dVar212 = dVar194 * (double)((ulong)dVar186 & 0x8000000000000000 |
                                                        0x3ff0000000000000) *
                                      (1.0 - pdVar39[lVar180 + lVar101 + (lVar2 - lVar149)] *
                                             dVar183) * 0.5 + dVar212;
                            goto LAB_00313c2d;
                          }
                        }
                        dVar212 = pdVar35[lVar125 + lVar95 + lVar100 + (lVar2 - lVar147)];
                        dVar194 = (pdVar35 + lVar125 + lVar95 + lVar100 + (lVar2 - lVar147))[1];
                        dVar191 = dVar212 - pdVar35[lVar125 + lVar95 + lVar100 + (int)(iVar144 -
                                                                                      uVar8)];
                        dVar207 = dVar194 - dVar212;
                        dVar191 = dVar191 + dVar191;
                        dVar207 = dVar207 + dVar207;
                        dVar197 = (dVar194 -
                                  pdVar35[lVar125 + lVar95 + lVar100 + (int)(iVar144 - uVar8)]) *
                                  0.5;
                        dVar199 = ABS(dVar191);
                        uVar182 = -(ulong)(0.0 < dVar197);
                        dVar197 = ABS(dVar197);
                        dVar194 = ABS(dVar207);
                        if (dVar199 <= dVar197) {
                          dVar197 = dVar199;
                        }
                        if (dVar197 <= dVar194) {
                          dVar194 = dVar197;
                        }
                        uVar189 = -(ulong)(0.0 < dVar191 * dVar207) & (ulong)dVar194;
                        dVar212 = (double)(~uVar182 & (uVar189 ^ 0x8000000000000000) |
                                          uVar182 & uVar189) *
                                  (1.0 - pdVar39[lVar180 + lVar101 + (lVar2 - lVar149)] * dVar183) *
                                  0.5 + dVar212;
                      }
                    }
LAB_00313c2d:
                    pdVar46[local_7e0 * lVar49 +
                            (lVar117 - iVar13) * lVar48 +
                            (lVar141 - iVar12) * lVar47 + (long)(int)(~uVar11 + iVar89)] = dVar212;
                    pdVar42[local_7e0 * lVar45 +
                            (lVar117 - iVar10) * lVar44 +
                            (lVar141 - iVar9) * lVar43 + (lVar112 - iVar7)] = dVar184;
                    lVar112 = lVar112 + 1;
                    pdVar159 = pdVar159 + 1;
                    pdVar145 = pdVar145 + 1;
                    local_698 = local_698 + 1;
                    iVar163 = iVar163 + 1;
                    iVar84 = iVar84 + 1;
                    iVar3 = iVar3 + 1;
                    lVar138 = lVar138 + 8;
                  } while (iVar29 + 1 != (int)lVar112);
                }
                lVar141 = lVar141 + 1;
              } while ((int)uVar97 != iVar30 + 1);
            }
            lVar117 = lVar117 + 1;
          } while (iVar31 + 1 != (int)lVar117);
        }
        local_7e0 = local_7e0 + 1;
        local_758 = local_758 + lVar38;
        if (local_7e0 == 3) {
          return;
        }
      } while( true );
    }
  }
  else {
    iVar7 = (xebox->bigend).vect[0];
  }
  local_2d8.q.p = q->p;
  local_2d8.q.jstride = q->jstride;
  local_2d8.q.kstride = q->kstride;
  local_2d8.q.nstride = q->nstride;
  local_2d8.q.begin.x = (q->begin).x;
  local_2d8.q.begin.y = (q->begin).y;
  uVar71 = *(undefined8 *)&(q->begin).z;
  uVar72 = (q->end).y;
  local_2d8.q._52_8_ = *(undefined8 *)&(q->end).z;
  local_2d8.q.begin.z = (int)uVar71;
  local_2d8.q.end.x = (int)((ulong)uVar71 >> 0x20);
  local_2d8.ccvel.p = ccvel->p;
  local_2d8.ccvel.jstride = ccvel->jstride;
  local_2d8.ccvel.kstride = ccvel->kstride;
  local_2d8.ccvel.nstride = ccvel->nstride;
  local_2d8.ccvel.begin.x = (ccvel->begin).x;
  local_2d8.ccvel.begin.y = (ccvel->begin).y;
  uVar73 = (ccvel->end).x;
  uVar74 = (ccvel->end).y;
  local_2d8.ccvel._52_8_ = *(undefined8 *)&(ccvel->end).z;
  local_2d8.ccvel.begin.z = (int)*(undefined8 *)&(ccvel->begin).z;
  local_2d8.Imx.p = Imx->p;
  local_2d8.Imx.jstride = Imx->jstride;
  local_2d8.Imx.kstride = Imx->kstride;
  local_2d8.Imx.nstride = Imx->nstride;
  local_2d8.Imx.begin.x = (Imx->begin).x;
  local_2d8.Imx.begin.y = (Imx->begin).y;
  uVar71 = *(undefined8 *)&(Imx->begin).z;
  uVar75 = (Imx->end).y;
  local_2d8.Imx._52_8_ = *(undefined8 *)&(Imx->end).z;
  local_2d8.Imx.begin.z = (int)uVar71;
  local_2d8.Imx.end.x = (int)((ulong)uVar71 >> 0x20);
  local_2d8.Ipx.p = Ipx->p;
  local_2d8.Ipx.jstride = Ipx->jstride;
  local_2d8.Ipx.kstride = Ipx->kstride;
  local_2d8.Ipx.nstride = Ipx->nstride;
  local_2d8.Ipx.begin.x = (Ipx->begin).x;
  local_2d8.Ipx.begin.y = (Ipx->begin).y;
  uVar76 = (Ipx->end).x;
  uVar77 = (Ipx->end).y;
  local_2d8.Ipx._52_8_ = *(undefined8 *)&(Ipx->end).z;
  local_2d8.Ipx.begin.z = (int)*(undefined8 *)&(Ipx->begin).z;
  local_2d8.pbc = pbc;
  local_2d8.flag.p = flag->p;
  local_2d8.flag.jstride = flag->jstride;
  local_2d8.flag.kstride = flag->kstride;
  local_2d8.flag.nstride = flag->nstride;
  local_2d8.flag.begin.x = (flag->begin).x;
  local_2d8.flag.begin.y = (flag->begin).y;
  uVar71 = *(undefined8 *)&(flag->begin).z;
  uVar78 = (flag->end).y;
  local_2d8.flag._52_8_ = *(undefined8 *)&(flag->end).z;
  local_2d8.flag.begin.z = (int)uVar71;
  local_2d8.flag.end.x = (int)((ulong)uVar71 >> 0x20);
  local_2d8.ccc.p = ccc->p;
  local_2d8.ccc.jstride = ccc->jstride;
  local_2d8.ccc.kstride = ccc->kstride;
  local_2d8.ccc.nstride = ccc->nstride;
  local_2d8.ccc.begin.x = (ccc->begin).x;
  local_2d8.ccc.begin.y = (ccc->begin).y;
  uVar71 = *(undefined8 *)&(ccc->begin).z;
  uVar79 = (ccc->end).y;
  local_2d8.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
  local_2d8.ccc.begin.z = (int)uVar71;
  local_2d8.ccc.end.x = (int)((ulong)uVar71 >> 0x20);
  local_2d8.vfrac.p = vfrac->p;
  local_2d8.vfrac.jstride = vfrac->jstride;
  local_2d8.vfrac.kstride = vfrac->kstride;
  local_2d8.vfrac.nstride = vfrac->nstride;
  local_2d8.vfrac.begin.x = (vfrac->begin).x;
  local_2d8.vfrac.begin.y = (vfrac->begin).y;
  uVar71 = *(undefined8 *)&(vfrac->begin).z;
  uVar80 = (vfrac->end).y;
  local_2d8.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
  local_2d8.vfrac.begin.z = (int)uVar71;
  local_2d8.vfrac.end.x = (int)((ulong)uVar71 >> 0x20);
  local_2d8.fcx.p = fcx->p;
  local_2d8.fcx.jstride = fcx->jstride;
  local_2d8.fcx.kstride = fcx->kstride;
  local_2d8.fcx.nstride = fcx->nstride;
  local_2d8.fcx.begin.x = (fcx->begin).x;
  local_2d8.fcx.begin.y = (fcx->begin).y;
  uVar71 = *(undefined8 *)&(fcx->begin).z;
  uVar81 = (fcx->end).y;
  local_2d8.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
  local_2d8.fcx.begin.z = (int)uVar71;
  local_2d8.fcx.end.x = (int)((ulong)uVar71 >> 0x20);
  local_2d8.fcy.p = fcy->p;
  local_2d8.fcy.jstride = fcy->jstride;
  local_2d8.fcy.kstride = fcy->kstride;
  local_2d8.fcy.nstride = fcy->nstride;
  local_2d8.fcy.begin.x = (fcy->begin).x;
  local_2d8.fcy.begin.y = (fcy->begin).y;
  uVar71 = *(undefined8 *)&(fcy->begin).z;
  uVar82 = (fcy->end).y;
  local_2d8.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
  local_2d8.fcy.begin.z = (int)uVar71;
  local_2d8.fcy.end.x = (int)((ulong)uVar71 >> 0x20);
  local_2d8.fcz.p = fcz->p;
  local_2d8.fcz.jstride = fcz->jstride;
  local_2d8.fcz.kstride = fcz->kstride;
  local_2d8.fcz.nstride = fcz->nstride;
  local_2d8.fcz.begin.x = (fcz->begin).x;
  local_2d8.fcz.begin.y = (fcz->begin).y;
  uVar71 = *(undefined8 *)&(fcz->begin).z;
  uVar83 = (fcz->end).y;
  local_2d8.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
  local_2d8.fcz.begin.z = (int)uVar71;
  local_2d8.fcz.end.x = (int)((ulong)uVar71 >> 0x20);
  iVar9 = (xebox->smallend).vect[0];
  iVar10 = (xebox->smallend).vect[1];
  iVar12 = (xebox->smallend).vect[2];
  iVar13 = (xebox->bigend).vect[1];
  iVar14 = (xebox->bigend).vect[2];
  iVar146 = 0;
  local_2d8.q.end.y = uVar72;
  local_2d8.ccvel.end.x = uVar73;
  local_2d8.ccvel.end.y = uVar74;
  local_2d8.domain_ilo = iVar177;
  local_2d8.domain_jlo = iVar178;
  local_2d8.domain_klo = iVar5;
  local_2d8.domain_ihi = iVar168;
  local_2d8.domain_jhi = iVar4;
  local_2d8.domain_khi = iVar6;
  local_2d8.Imx.end.y = uVar75;
  local_2d8.Ipx.end.x = uVar76;
  local_2d8.Ipx.end.y = uVar77;
  local_2d8.dtdx = dVar183;
  local_2d8.flag.end.y = uVar78;
  local_2d8.ccc.end.y = uVar79;
  local_2d8.vfrac.end.y = uVar80;
  local_2d8.fcx.end.y = uVar81;
  local_2d8.fcy.end.y = uVar82;
  local_2d8.fcz.end.y = uVar83;
  do {
    iVar177 = iVar12;
    if (iVar12 <= iVar14) {
      do {
        iVar178 = iVar10;
        if (iVar10 <= iVar13) {
          do {
            iVar168 = iVar9;
            if (iVar9 <= iVar7) {
              do {
                PredictVelOnXFace::anon_class_680_18_15492e0f::operator()
                          (&local_2d8,iVar168,iVar178,iVar177,iVar146);
                iVar168 = iVar168 + 1;
              } while (iVar7 + 1 != iVar168);
            }
            bVar181 = iVar178 != iVar13;
            iVar178 = iVar178 + 1;
          } while (bVar181);
        }
        bVar181 = iVar177 != iVar14;
        iVar177 = iVar177 + 1;
      } while (bVar181);
    }
    iVar146 = iVar146 + 1;
  } while (iVar146 != 3);
  return;
}

Assistant:

void
EBPLM::PredictVelOnXFace (Box const& xebox,
                          Array4<Real> const& Imx, Array4<Real> const& Ipx,
                          Array4<Real const> const& q,
                          Array4<Real const> const& ccvel,
                          Array4<EBCellFlag const> const& flag,
                          Array4<Real const> const& vfrac,
                          AMREX_D_DECL(Array4<Real const> const& fcx,
                                       Array4<Real const> const& fcy,
                                       Array4<Real const> const& fcz),
                          Array4<Real const> const& ccc,
                          Geometry& geom,
                          Real dt,
                          Vector<BCRec> const& h_bcrec,
                          BCRec const* pbc)
{
    const Real dx = geom.CellSize(0);
    const Real dtdx = dt/dx;

    int ncomp = AMREX_SPACEDIM;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::y));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;

#if (AMREX_SPACEDIM == 3)
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;
#endif

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= xebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= xebox.bigEnd(0)    ) ||
#if (AMREX_SPACEDIM == 3)
         (has_extdir_or_ho_lo_z && domain_klo >= xebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= xebox.bigEnd(2)    ) ||
#endif
         (has_extdir_or_ho_lo_y && domain_jlo >= xebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= xebox.bigEnd(1)    ) )
    {
        amrex::ParallelFor(xebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                  AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imx,Ipx,dtdx,pbc,flag,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apx(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(-1,0,0))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
#if (AMREX_SPACEDIM == 3)
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);
#endif

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. &&
                                           vfrac(i+1,j,k) == 1. && vfrac(i+2,j,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i  ,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,0) * dtdx) *
                        amrex_calc_xslope_extdir(i,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i-1,j,k) == 1. && vfrac(i+1,j,k) == 1.) {

                    int order = 2;
                    qpls = q(i  ,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,0) * dtdx) *
                        amrex_calc_xslope_extdir(i,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

                // We need to use LS slopes
                } else {

                    Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                    Real zf = fcx(i,j,k,1);
#endif
                    AMREX_D_TERM(Real delta_x = -0.5 - ccc(i,j,k,0);,
                                 Real delta_y =  yf  - ccc(i,j,k,1);,
                                 Real delta_z =  zf  - ccc(i,j,k,2););

                    Real qcc_max = amrex::max(q(i,j,k,n), q(i-1,j,k,n));
                    Real qcc_min = amrex::min(q(i,j,k,n), q(i-1,j,k,n));

                    // This will be used in the EB slope routine only if the slope can be computed without LS
                    int max_order = 2;

                    const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                               AMREX_D_DECL(fcx,fcy,fcz), flag,
                                               AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                               AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                               AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                               AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                               max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdx * ccvel(i,j,k,0) * slopes_eb_hi[0];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i-1,j,k) with all values at cell centers
                if (vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. && vfrac(i-3,j,k) == 1. &&
                                             vfrac(i  ,j,k) == 1. && vfrac(i+1,j,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i-1,j,k,n) + 0.5 * ( 1.0 - ccvel(i-1,j,k,0) * dtdx) *
                        amrex_calc_xslope_extdir(i-1,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. && vfrac(i  ,j,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i-1,j,k,n) + 0.5 * ( 1.0 - ccvel(i-1,j,k,0) * dtdx) *
                        amrex_calc_xslope_extdir(i-1,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

                // We need to use LS slopes
                } else {

                    Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                    Real zf = fcx(i,j,k,1);
#endif
                    AMREX_D_TERM(Real delta_x = 0.5 - ccc(i-1,j,k,0);,
                                 Real delta_y = yf  - ccc(i-1,j,k,1);,
                                 Real delta_z = zf  - ccc(i-1,j,k,2););

                    Real qcc_max = amrex::max(q(i,j,k,n), q(i-1,j,k,n));
                    Real qcc_min = amrex::min(q(i,j,k,n), q(i-1,j,k,n));

                    // This will be used in the EB slope routine only if the slope can be computed without LS
                    int max_order = 2;

                    const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i-1,j,k,n,q,ccc,vfrac,
                                               AMREX_D_DECL(fcx,fcy,fcz), flag,
                                               AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                               AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                               AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                               AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                               max_order);


#if (AMREX_SPACEDIM == 3)
                   qmns = q(i-1,j,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i-1,j,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdx * ccvel(i-1,j,k,0) * slopes_eb_lo[0];

                }  // end of making qmns
            }

            Ipx(i-1,j,k,n) = qmns;
            Imx(i  ,j,k,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(xebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                          AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imx,Ipx,dtdx,pbc,flag,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apx(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(-1,0,0))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. &&
                                           vfrac(i+1,j,k) == 1. && vfrac(i+2,j,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i  ,j,k,n) + 0.5 * (-1.0 - ccvel(i  ,j,k,0) * dtdx) *
                        amrex_calc_xslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i-1,j,k) == 1. && vfrac(i+1,j,k) == 1.) {

                    int order = 2;
                    qpls = q(i  ,j,k,n) + 0.5 * (-1.0 - ccvel(i  ,j,k,0) * dtdx) *
                        amrex_calc_xslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcx(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_x = -0.5 - ccc(i,j,k,0);,
                                Real delta_y =  yf  - ccc(i,j,k,1);,
                                Real delta_z =  zf  - ccc(i,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i-1,j,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i-1,j,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdx * ccvel(i,j,k,0) * slopes_eb_hi[0];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i-1,j,k) with all values at cell centers
                if (vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. && vfrac(i-3,j,k) == 1. &&
                                             vfrac(i  ,j,k) == 1. && vfrac(i+1,j,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i-1,j,k,n) + 0.5 * ( 1.0 - ccvel(i-1,j,k,0) * dtdx) *
                        amrex_calc_xslope(i-1,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. && vfrac(i  ,j,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i-1,j,k,n) + 0.5 * ( 1.0 - ccvel(i-1,j,k,0) * dtdx) *
                        amrex_calc_xslope(i-1,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcx(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_x = 0.5 - ccc(i-1,j,k,0);,
                                Real delta_y = yf  - ccc(i-1,j,k,1);,
                                Real delta_z = zf  - ccc(i-1,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i-1,j,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i-1,j,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i-1,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qmns = q(i-1,j,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i-1,j,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdx * ccvel(i-1,j,k,0) * slopes_eb_lo[0];

                }  // end of making qmns
            }

            Ipx(i-1,j,k,n) = qmns;
            Imx(i  ,j,k,n) = qpls;
        });
    }
}